

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase671::run(TestCase671 *this)

{
  Builder reader_00;
  Reader reader_01;
  ulong uVar1;
  long lVar2;
  initializer_list<unsigned_short> expected;
  initializer_list<unsigned_short> expected_00;
  Reader reader;
  Fault f_1;
  Builder root;
  Builder l;
  MallocMessageBuilder builder;
  StructBuilder local_358;
  ListElementCount local_330;
  uint local_324;
  StructReader local_320;
  ListElementCount local_2ec;
  StructBuilder local_2e8;
  ListBuilder local_2c0;
  ListReader local_298;
  Maybe<kj::Exception> local_268;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_358,&local_108.super_MessageBuilder);
  local_268.ptr.field_1.value.ownFile.content.size_ = (size_t)local_358.data;
  local_268.ptr._0_8_ = local_358.segment;
  local_268.ptr.field_1.value.ownFile.content.ptr = (char *)local_358.capTable;
  PointerBuilder::initStruct(&local_2e8,(PointerBuilder *)&local_268,(StructSize)0x10000);
  local_320.segment = (SegmentReader *)0x7801560134001201;
  local_358.segment = local_2e8.segment;
  local_358.capTable = local_2e8.capTable;
  local_358.data = local_2e8.pointers;
  PointerBuilder::initList((ListBuilder *)&local_268,(PointerBuilder *)&local_358,TWO_BYTES,4);
  uVar1 = 0;
  lVar2 = 0;
  do {
    *(undefined2 *)(local_268.ptr.field_1.value.ownFile.content.size_ + (uVar1 >> 3)) =
         *(undefined2 *)((long)&local_320.segment + lVar2);
    lVar2 = lVar2 + 2;
    uVar1 = uVar1 + (uint)local_268.ptr.field_1._20_4_;
  } while (lVar2 != 8);
  local_358.segment = (SegmentBuilder *)&PTR_run_003725f0;
  local_358.capTable = (CapTableBuilder *)&local_2e8;
  kj::_::runCatchingExceptions(&local_268,(Runnable *)&local_358);
  if (local_268.ptr.isSet == true) {
    kj::Exception::~Exception(&local_268.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2a7,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
               ,(char (*) [112])
                "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
              );
  }
  local_358.segment = local_2e8.segment;
  local_358.capTable = local_2e8.capTable;
  local_358.data = local_2e8.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_268,(PointerBuilder *)&local_358,(StructSize)0x1,(word *)0x0);
  if (local_268.ptr.field_1._16_4_ == 4) {
    ListBuilder::getStructElement(&local_358,(ListBuilder *)&local_268,0);
    if (((((WireValue<uint32_t> *)local_358.data)->value & 1) == 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ac,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
    }
    ListBuilder::getStructElement(&local_358,(ListBuilder *)&local_268,1);
    if (((((WireValue<uint32_t> *)local_358.data)->value & 1) != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ad,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
    }
    ListBuilder::getStructElement(&local_358,(ListBuilder *)&local_268,2);
    if (((((WireValue<uint32_t> *)local_358.data)->value & 1) == 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ae,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
    }
    ListBuilder::getStructElement(&local_358,(ListBuilder *)&local_268,3);
    if (((((WireValue<uint32_t> *)local_358.data)->value & 1) == 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2af,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
    }
    local_268.ptr._0_8_ = local_2e8.segment;
    local_268.ptr.field_1.value.ownFile.content.ptr = (char *)local_2e8.capTable;
    local_268.ptr.field_1.value.ownFile.content.size_ = (size_t)local_2e8.pointers;
    PointerBuilder::getList(&local_2c0,(PointerBuilder *)&local_268,TWO_BYTES,(word *)0x0);
    local_268.ptr._0_8_ = (SegmentBuilder *)0x7801560134001201;
    reader_00.builder.capTable = local_2c0.capTable;
    reader_00.builder.segment = local_2c0.segment;
    reader_00.builder.ptr = local_2c0.ptr;
    reader_00.builder.elementCount = local_2c0.elementCount;
    reader_00.builder.step = local_2c0.step;
    reader_00.builder.structDataSize = local_2c0.structDataSize;
    reader_00.builder.structPointerCount = local_2c0.structPointerCount;
    reader_00.builder.elementSize = local_2c0.elementSize;
    reader_00.builder._39_1_ = local_2c0._39_1_;
    expected._M_len = 4;
    expected._M_array = (iterator)&local_268;
    checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
              (reader_00,expected);
    StructBuilder::asReader(&local_2e8);
    local_320.segment = (SegmentReader *)&PTR_run_00372620;
    local_320.capTable = (CapTableReader *)&local_2e8;
    kj::_::runCatchingExceptions(&local_268,(Runnable *)&local_320);
    if (local_268.ptr.isSet == true) {
      kj::Exception::~Exception(&local_268.ptr.field_1.value);
    }
    else if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2b7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
    }
    local_320.capTable = &(local_358.capTable)->super_CapTableReader;
    local_320.data = local_358.pointers;
    local_320.segment = &(local_358.segment)->super_SegmentReader;
    local_320.pointers._0_4_ = local_330;
    if (local_358.pointerCount == 0) {
      local_320.capTable = (CapTableReader *)0x0;
      local_320.data = (WirePointer *)0x0;
      local_320.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
      local_320.pointers._0_4_ = 0x7fffffff;
    }
    PointerReader::getList
              ((ListReader *)&local_268,(PointerReader *)&local_320,INLINE_COMPOSITE,(word *)0x0);
    if (local_268.ptr.field_1._16_4_ == 4) {
      ListReader::getStructElement(&local_320,(ListReader *)&local_268,0);
      if (((local_320.dataSize == 0) || ((((WireValue<uint32_t> *)local_320.data)->value & 1) == 0))
         && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[29]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,700,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                   (char (*) [29])"failed: expected l[0].getF()");
      }
      ListReader::getStructElement(&local_320,(ListReader *)&local_268,1);
      if (((local_320.dataSize != 0) && ((((WireValue<uint32_t> *)local_320.data)->value & 1) != 0))
         && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[32]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x2bd,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                   (char (*) [32])"failed: expected !(l[1].getF())");
      }
      ListReader::getStructElement(&local_320,(ListReader *)&local_268,2);
      if (((local_320.dataSize == 0) || ((((WireValue<uint32_t> *)local_320.data)->value & 1) == 0))
         && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[29]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x2be,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                   (char (*) [29])"failed: expected l[2].getF()");
      }
      ListReader::getStructElement(&local_320,(ListReader *)&local_268,3);
      if (((local_320.dataSize == 0) || ((((WireValue<uint32_t> *)local_320.data)->value & 1) == 0))
         && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[29]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                   ,0x2bf,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                   (char (*) [29])"failed: expected l[3].getF()");
      }
      local_268.ptr.field_1.value.ownFile.content.ptr = (char *)local_358.capTable;
      local_268.ptr._0_8_ = local_358.segment;
      if (local_358.pointerCount == 0) {
        local_330 = 0x7fffffff;
        local_358.pointers = (WirePointer *)0x0;
        local_268.ptr.field_1.value.ownFile.content.ptr = (char *)(CapTableReader *)0x0;
        local_268.ptr._0_8_ = (SegmentBuilder *)0x0;
      }
      local_268.ptr.field_1.value.ownFile.content.size_ = (size_t)local_358.pointers;
      local_268.ptr.field_1._16_4_ = local_330;
      PointerReader::getList(&local_298,(PointerReader *)&local_268,TWO_BYTES,(word *)0x0);
      local_268.ptr._0_8_ = (SegmentBuilder *)0x7801560134001201;
      reader_01.reader.capTable = local_298.capTable;
      reader_01.reader.segment = local_298.segment;
      reader_01.reader.ptr = local_298.ptr;
      reader_01.reader.elementCount = local_298.elementCount;
      reader_01.reader.step = local_298.step;
      reader_01.reader.structDataSize = local_298.structDataSize;
      reader_01.reader.structPointerCount = local_298.structPointerCount;
      reader_01.reader.elementSize = local_298.elementSize;
      reader_01.reader._39_1_ = local_298._39_1_;
      reader_01.reader.nestingLimit = local_298.nestingLimit;
      reader_01.reader._44_4_ = local_298._44_4_;
      expected_00._M_len = 4;
      expected_00._M_array = (iterator)&local_268;
      checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
                (reader_01,expected_00);
      MallocMessageBuilder::~MallocMessageBuilder(&local_108);
      return;
    }
    local_324 = 4;
    local_2ec = local_268.ptr.field_1._16_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,699,FAILED,"(4u) == (l.size())","4u, l.size()",&local_324,&local_2ec);
    kj::_::Debug::Fault::fatal((Fault *)&local_320);
  }
  local_320.segment = (SegmentReader *)CONCAT44(local_320.segment._4_4_,4);
  local_324 = local_268.ptr.field_1._16_4_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x2ab,FAILED,"(4u) == (l.size())","4u, l.size()",(uint *)&local_320,&local_324);
  kj::_::Debug::Fault::fatal((Fault *)&local_358);
}

Assistant:

TEST(Encoding, BitListDowngrade) {
  // NO LONGER SUPPORTED -- We check for exceptions thrown.

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({0x1201u, 0x3400u, 0x5601u, 0x7801u});

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(),
            {0x1201u, 0x3400u, 0x5601u, 0x7801u});

  auto reader = root.asReader();

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(),
            {0x1201u, 0x3400u, 0x5601u, 0x7801u});
}